

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# erase_if_test.cc
# Opt level: O1

void __thiscall
phmap::priv::anon_unknown_0::EraseIf_FlatHashSet_uint32_Test::TestBody
          (EraseIf_FlatHashSet_uint32_Test *this)

{
  char *pcVar1;
  char cVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  undefined1 auVar16 [11];
  undefined1 auVar17 [11];
  undefined1 auVar18 [11];
  undefined1 auVar19 [11];
  undefined1 auVar20 [12];
  undefined1 auVar21 [12];
  undefined1 auVar22 [12];
  undefined1 auVar23 [12];
  undefined1 auVar24 [13];
  undefined1 auVar25 [13];
  undefined1 auVar26 [13];
  undefined1 auVar27 [13];
  undefined1 auVar28 [14];
  undefined1 auVar29 [14];
  undefined1 auVar30 [14];
  undefined1 auVar31 [14];
  int *piVar32;
  undefined8 uVar33;
  size_t sVar34;
  uint uVar35;
  ctrl_t *pcVar36;
  anon_union_8_1_a8a14541_for_iterator_1 aVar37;
  ulong uVar38;
  key_equal *pkVar39;
  pointer *__ptr;
  int *piVar40;
  bool bVar41;
  char in_XMM1_Ba;
  char in_XMM1_Bb;
  char in_XMM1_Bc;
  char in_XMM1_Bd;
  char in_XMM1_Be;
  char in_XMM1_Bf;
  char in_XMM1_Bg;
  char in_XMM1_Bh;
  char in_XMM1_Bi;
  char in_XMM1_Bj;
  char in_XMM1_Bk;
  char in_XMM1_Bl;
  char in_XMM1_Bm;
  char in_XMM1_Bn;
  char in_XMM1_Bo;
  byte in_XMM1_Bp;
  iterator it;
  iterator it_00;
  AssertionResult gtest_ar__1;
  AssertionResult gtest_ar_;
  flat_hash_set<unsigned_int,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<unsigned_int>_>
  st2;
  flat_hash_set<unsigned_int,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<unsigned_int>_>
  st1;
  AssertHelper local_c0;
  AssertHelper local_b8;
  Message local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_a8;
  undefined1 local_a0 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbStack_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_90;
  undefined1 local_80 [48];
  raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<unsigned_int>_>
  local_50;
  
  local_80._0_8_ = (int *)0x600000003;
  local_80._8_8_ = (slot_type *)0x900000007;
  pkVar39 = (key_equal *)&local_b0;
  raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_int>,phmap::Hash<unsigned_int>,phmap::EqualTo<unsigned_int>,std::allocator<unsigned_int>>
  ::raw_hash_set<int_const*>
            ((raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_int>,phmap::Hash<unsigned_int>,phmap::EqualTo<unsigned_int>,std::allocator<unsigned_int>>
              *)&local_50,(int *)local_80,(int *)(local_80 + 0x10),0,(hasher *)local_a0,pkVar39,
             (allocator_type *)&local_c0);
  sVar34 = local_50.size_;
  cVar2 = *local_50.ctrl_;
  pcVar1 = local_50.ctrl_;
  while (cVar2 < -1) {
    iVar12 = -(uint)(CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))) ==
                    CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))));
    iVar13 = -(uint)(CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))) ==
                    CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))));
    iVar14 = -(uint)(CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))) ==
                    CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))));
    iVar15 = -(uint)(CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))) ==
                    CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))));
    in_XMM1_Ba = -(*pcVar1 < (char)iVar12);
    in_XMM1_Bb = -(pcVar1[1] < (char)((uint)iVar12 >> 8));
    in_XMM1_Bc = -(pcVar1[2] < (char)((uint)iVar12 >> 0x10));
    in_XMM1_Bd = -(pcVar1[3] < (char)((uint)iVar12 >> 0x18));
    in_XMM1_Be = -(pcVar1[4] < (char)iVar13);
    in_XMM1_Bf = -(pcVar1[5] < (char)((uint)iVar13 >> 8));
    in_XMM1_Bg = -(pcVar1[6] < (char)((uint)iVar13 >> 0x10));
    in_XMM1_Bh = -(pcVar1[7] < (char)((uint)iVar13 >> 0x18));
    in_XMM1_Bi = -(pcVar1[8] < (char)iVar14);
    in_XMM1_Bj = -(pcVar1[9] < (char)((uint)iVar14 >> 8));
    in_XMM1_Bk = -(pcVar1[10] < (char)((uint)iVar14 >> 0x10));
    in_XMM1_Bl = -(pcVar1[0xb] < (char)((uint)iVar14 >> 0x18));
    in_XMM1_Bm = -(pcVar1[0xc] < (char)iVar15);
    in_XMM1_Bn = -(pcVar1[0xd] < (char)((uint)iVar15 >> 8));
    in_XMM1_Bo = -(pcVar1[0xe] < (char)((uint)iVar15 >> 0x10));
    in_XMM1_Bp = -(pcVar1[0xf] < (char)((uint)iVar15 >> 0x18));
    auVar4[1] = in_XMM1_Bb;
    auVar4[0] = in_XMM1_Ba;
    auVar4[2] = in_XMM1_Bc;
    auVar4[3] = in_XMM1_Bd;
    auVar4[4] = in_XMM1_Be;
    auVar4[5] = in_XMM1_Bf;
    auVar4[6] = in_XMM1_Bg;
    auVar4[7] = in_XMM1_Bh;
    auVar4[8] = in_XMM1_Bi;
    auVar4[9] = in_XMM1_Bj;
    auVar4[10] = in_XMM1_Bk;
    auVar4[0xb] = in_XMM1_Bl;
    auVar4[0xc] = in_XMM1_Bm;
    auVar4[0xd] = in_XMM1_Bn;
    auVar4[0xe] = in_XMM1_Bo;
    auVar4[0xf] = in_XMM1_Bp;
    auVar5[1] = in_XMM1_Bb;
    auVar5[0] = in_XMM1_Ba;
    auVar5[2] = in_XMM1_Bc;
    auVar5[3] = in_XMM1_Bd;
    auVar5[4] = in_XMM1_Be;
    auVar5[5] = in_XMM1_Bf;
    auVar5[6] = in_XMM1_Bg;
    auVar5[7] = in_XMM1_Bh;
    auVar5[8] = in_XMM1_Bi;
    auVar5[9] = in_XMM1_Bj;
    auVar5[10] = in_XMM1_Bk;
    auVar5[0xb] = in_XMM1_Bl;
    auVar5[0xc] = in_XMM1_Bm;
    auVar5[0xd] = in_XMM1_Bn;
    auVar5[0xe] = in_XMM1_Bo;
    auVar5[0xf] = in_XMM1_Bp;
    auVar28[1] = in_XMM1_Bd;
    auVar28[0] = in_XMM1_Bc;
    auVar28[2] = in_XMM1_Be;
    auVar28[3] = in_XMM1_Bf;
    auVar28[4] = in_XMM1_Bg;
    auVar28[5] = in_XMM1_Bh;
    auVar28[6] = in_XMM1_Bi;
    auVar28[7] = in_XMM1_Bj;
    auVar28[8] = in_XMM1_Bk;
    auVar28[9] = in_XMM1_Bl;
    auVar28[10] = in_XMM1_Bm;
    auVar28[0xb] = in_XMM1_Bn;
    auVar28[0xc] = in_XMM1_Bo;
    auVar28[0xd] = in_XMM1_Bp;
    auVar24[1] = in_XMM1_Be;
    auVar24[0] = in_XMM1_Bd;
    auVar24[2] = in_XMM1_Bf;
    auVar24[3] = in_XMM1_Bg;
    auVar24[4] = in_XMM1_Bh;
    auVar24[5] = in_XMM1_Bi;
    auVar24[6] = in_XMM1_Bj;
    auVar24[7] = in_XMM1_Bk;
    auVar24[8] = in_XMM1_Bl;
    auVar24[9] = in_XMM1_Bm;
    auVar24[10] = in_XMM1_Bn;
    auVar24[0xb] = in_XMM1_Bo;
    auVar24[0xc] = in_XMM1_Bp;
    auVar20[1] = in_XMM1_Bf;
    auVar20[0] = in_XMM1_Be;
    auVar20[2] = in_XMM1_Bg;
    auVar20[3] = in_XMM1_Bh;
    auVar20[4] = in_XMM1_Bi;
    auVar20[5] = in_XMM1_Bj;
    auVar20[6] = in_XMM1_Bk;
    auVar20[7] = in_XMM1_Bl;
    auVar20[8] = in_XMM1_Bm;
    auVar20[9] = in_XMM1_Bn;
    auVar20[10] = in_XMM1_Bo;
    auVar20[0xb] = in_XMM1_Bp;
    auVar16[1] = in_XMM1_Bg;
    auVar16[0] = in_XMM1_Bf;
    auVar16[2] = in_XMM1_Bh;
    auVar16[3] = in_XMM1_Bi;
    auVar16[4] = in_XMM1_Bj;
    auVar16[5] = in_XMM1_Bk;
    auVar16[6] = in_XMM1_Bl;
    auVar16[7] = in_XMM1_Bm;
    auVar16[8] = in_XMM1_Bn;
    auVar16[9] = in_XMM1_Bo;
    auVar16[10] = in_XMM1_Bp;
    uVar35 = (ushort)((ushort)(SUB161(auVar4 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar5 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB141(auVar28 >> 7,0) & 1) << 2 |
                      (ushort)(SUB131(auVar24 >> 7,0) & 1) << 3 |
                      (ushort)(SUB121(auVar20 >> 7,0) & 1) << 4 |
                      (ushort)(SUB111(auVar16 >> 7,0) & 1) << 5 |
                      (ushort)((byte)(CONCAT19(in_XMM1_Bp,
                                               CONCAT18(in_XMM1_Bo,
                                                        CONCAT17(in_XMM1_Bn,
                                                                 CONCAT16(in_XMM1_Bm,
                                                                          CONCAT15(in_XMM1_Bl,
                                                                                   CONCAT14(
                                                  in_XMM1_Bk,
                                                  CONCAT13(in_XMM1_Bj,
                                                           CONCAT12(in_XMM1_Bi,
                                                                    CONCAT11(in_XMM1_Bh,in_XMM1_Bg))
                                                          ))))))) >> 7) & 1) << 6 |
                      (ushort)((byte)(CONCAT18(in_XMM1_Bp,
                                               CONCAT17(in_XMM1_Bo,
                                                        CONCAT16(in_XMM1_Bn,
                                                                 CONCAT15(in_XMM1_Bm,
                                                                          CONCAT14(in_XMM1_Bl,
                                                                                   CONCAT13(
                                                  in_XMM1_Bk,
                                                  CONCAT12(in_XMM1_Bj,
                                                           CONCAT11(in_XMM1_Bi,in_XMM1_Bh)))))))) >>
                                     7) & 1) << 7 | (ushort)(in_XMM1_Bp >> 7) << 0xf) + 1;
    uVar3 = 0;
    if (uVar35 != 0) {
      for (; (uVar35 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
      }
    }
    local_50.slots_ = local_50.slots_ + uVar3;
    cVar2 = pcVar1[uVar3];
    pcVar1 = pcVar1 + uVar3;
  }
  it.field_1.slot_ = local_50.slots_;
  it.ctrl_ = pcVar1;
  if (pcVar1 != local_50.ctrl_ + local_50.capacity_) {
    do {
      if (*it.field_1.slot_ < 7) {
        pcVar36 = it.ctrl_ + 1;
        aVar37.slot_ = it.field_1.slot_ + 1;
        if (it.ctrl_[1] < -1) {
          do {
            iVar12 = -(uint)(CONCAT13(in_XMM1_Bd,
                                      CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))) ==
                            CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))
                                    ));
            iVar13 = -(uint)(CONCAT13(in_XMM1_Bh,
                                      CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))) ==
                            CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))
                                    ));
            iVar14 = -(uint)(CONCAT13(in_XMM1_Bl,
                                      CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))) ==
                            CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))
                                    ));
            iVar15 = -(uint)(CONCAT13(in_XMM1_Bp,
                                      CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))) ==
                            CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))
                                    ));
            in_XMM1_Ba = -(*pcVar36 < (char)iVar12);
            in_XMM1_Bb = -(pcVar36[1] < (char)((uint)iVar12 >> 8));
            in_XMM1_Bc = -(pcVar36[2] < (char)((uint)iVar12 >> 0x10));
            in_XMM1_Bd = -(pcVar36[3] < (char)((uint)iVar12 >> 0x18));
            in_XMM1_Be = -(pcVar36[4] < (char)iVar13);
            in_XMM1_Bf = -(pcVar36[5] < (char)((uint)iVar13 >> 8));
            in_XMM1_Bg = -(pcVar36[6] < (char)((uint)iVar13 >> 0x10));
            in_XMM1_Bh = -(pcVar36[7] < (char)((uint)iVar13 >> 0x18));
            in_XMM1_Bi = -(pcVar36[8] < (char)iVar14);
            in_XMM1_Bj = -(pcVar36[9] < (char)((uint)iVar14 >> 8));
            in_XMM1_Bk = -(pcVar36[10] < (char)((uint)iVar14 >> 0x10));
            in_XMM1_Bl = -(pcVar36[0xb] < (char)((uint)iVar14 >> 0x18));
            in_XMM1_Bm = -(pcVar36[0xc] < (char)iVar15);
            in_XMM1_Bn = -(pcVar36[0xd] < (char)((uint)iVar15 >> 8));
            in_XMM1_Bo = -(pcVar36[0xe] < (char)((uint)iVar15 >> 0x10));
            in_XMM1_Bp = -(pcVar36[0xf] < (char)((uint)iVar15 >> 0x18));
            auVar10[1] = in_XMM1_Bb;
            auVar10[0] = in_XMM1_Ba;
            auVar10[2] = in_XMM1_Bc;
            auVar10[3] = in_XMM1_Bd;
            auVar10[4] = in_XMM1_Be;
            auVar10[5] = in_XMM1_Bf;
            auVar10[6] = in_XMM1_Bg;
            auVar10[7] = in_XMM1_Bh;
            auVar10[8] = in_XMM1_Bi;
            auVar10[9] = in_XMM1_Bj;
            auVar10[10] = in_XMM1_Bk;
            auVar10[0xb] = in_XMM1_Bl;
            auVar10[0xc] = in_XMM1_Bm;
            auVar10[0xd] = in_XMM1_Bn;
            auVar10[0xe] = in_XMM1_Bo;
            auVar10[0xf] = in_XMM1_Bp;
            auVar11[1] = in_XMM1_Bb;
            auVar11[0] = in_XMM1_Ba;
            auVar11[2] = in_XMM1_Bc;
            auVar11[3] = in_XMM1_Bd;
            auVar11[4] = in_XMM1_Be;
            auVar11[5] = in_XMM1_Bf;
            auVar11[6] = in_XMM1_Bg;
            auVar11[7] = in_XMM1_Bh;
            auVar11[8] = in_XMM1_Bi;
            auVar11[9] = in_XMM1_Bj;
            auVar11[10] = in_XMM1_Bk;
            auVar11[0xb] = in_XMM1_Bl;
            auVar11[0xc] = in_XMM1_Bm;
            auVar11[0xd] = in_XMM1_Bn;
            auVar11[0xe] = in_XMM1_Bo;
            auVar11[0xf] = in_XMM1_Bp;
            auVar29[1] = in_XMM1_Bd;
            auVar29[0] = in_XMM1_Bc;
            auVar29[2] = in_XMM1_Be;
            auVar29[3] = in_XMM1_Bf;
            auVar29[4] = in_XMM1_Bg;
            auVar29[5] = in_XMM1_Bh;
            auVar29[6] = in_XMM1_Bi;
            auVar29[7] = in_XMM1_Bj;
            auVar29[8] = in_XMM1_Bk;
            auVar29[9] = in_XMM1_Bl;
            auVar29[10] = in_XMM1_Bm;
            auVar29[0xb] = in_XMM1_Bn;
            auVar29[0xc] = in_XMM1_Bo;
            auVar29[0xd] = in_XMM1_Bp;
            auVar25[1] = in_XMM1_Be;
            auVar25[0] = in_XMM1_Bd;
            auVar25[2] = in_XMM1_Bf;
            auVar25[3] = in_XMM1_Bg;
            auVar25[4] = in_XMM1_Bh;
            auVar25[5] = in_XMM1_Bi;
            auVar25[6] = in_XMM1_Bj;
            auVar25[7] = in_XMM1_Bk;
            auVar25[8] = in_XMM1_Bl;
            auVar25[9] = in_XMM1_Bm;
            auVar25[10] = in_XMM1_Bn;
            auVar25[0xb] = in_XMM1_Bo;
            auVar25[0xc] = in_XMM1_Bp;
            auVar21[1] = in_XMM1_Bf;
            auVar21[0] = in_XMM1_Be;
            auVar21[2] = in_XMM1_Bg;
            auVar21[3] = in_XMM1_Bh;
            auVar21[4] = in_XMM1_Bi;
            auVar21[5] = in_XMM1_Bj;
            auVar21[6] = in_XMM1_Bk;
            auVar21[7] = in_XMM1_Bl;
            auVar21[8] = in_XMM1_Bm;
            auVar21[9] = in_XMM1_Bn;
            auVar21[10] = in_XMM1_Bo;
            auVar21[0xb] = in_XMM1_Bp;
            auVar17[1] = in_XMM1_Bg;
            auVar17[0] = in_XMM1_Bf;
            auVar17[2] = in_XMM1_Bh;
            auVar17[3] = in_XMM1_Bi;
            auVar17[4] = in_XMM1_Bj;
            auVar17[5] = in_XMM1_Bk;
            auVar17[6] = in_XMM1_Bl;
            auVar17[7] = in_XMM1_Bm;
            auVar17[8] = in_XMM1_Bn;
            auVar17[9] = in_XMM1_Bo;
            auVar17[10] = in_XMM1_Bp;
            uVar35 = (ushort)((ushort)(SUB161(auVar10 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar11 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB141(auVar29 >> 7,0) & 1) << 2 |
                              (ushort)(SUB131(auVar25 >> 7,0) & 1) << 3 |
                              (ushort)(SUB121(auVar21 >> 7,0) & 1) << 4 |
                              (ushort)(SUB111(auVar17 >> 7,0) & 1) << 5 |
                              (ushort)((byte)(CONCAT19(in_XMM1_Bp,
                                                       CONCAT18(in_XMM1_Bo,
                                                                CONCAT17(in_XMM1_Bn,
                                                                         CONCAT16(in_XMM1_Bm,
                                                                                  CONCAT15(
                                                  in_XMM1_Bl,
                                                  CONCAT14(in_XMM1_Bk,
                                                           CONCAT13(in_XMM1_Bj,
                                                                    CONCAT12(in_XMM1_Bi,
                                                                             CONCAT11(in_XMM1_Bh,
                                                                                      in_XMM1_Bg))))
                                                  ))))) >> 7) & 1) << 6 |
                              (ushort)((byte)(CONCAT18(in_XMM1_Bp,
                                                       CONCAT17(in_XMM1_Bo,
                                                                CONCAT16(in_XMM1_Bn,
                                                                         CONCAT15(in_XMM1_Bm,
                                                                                  CONCAT14(
                                                  in_XMM1_Bl,
                                                  CONCAT13(in_XMM1_Bk,
                                                           CONCAT12(in_XMM1_Bj,
                                                                    CONCAT11(in_XMM1_Bi,in_XMM1_Bh))
                                                          )))))) >> 7) & 1) << 7 |
                             (ushort)(in_XMM1_Bp >> 7) << 0xf) + 1;
            uVar3 = 0;
            if (uVar35 != 0) {
              for (; (uVar35 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
              }
            }
            aVar37.slot_ = aVar37.slot_ + uVar3;
            it.field_1.slot_ = aVar37.slot_;
            it.ctrl_ = pcVar36 + uVar3;
            pcVar1 = pcVar36 + uVar3;
            pcVar36 = pcVar36 + uVar3;
          } while (*pcVar1 < -1);
        }
        else {
          it.field_1.slot_ = aVar37.slot_;
          it.ctrl_ = pcVar36;
        }
      }
      else {
        it = raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<unsigned_int>_>
             ::erase(&local_50,it);
      }
    } while (it.ctrl_ != local_50.ctrl_ + local_50.capacity_);
  }
  bVar41 = sVar34 - local_50.size_ == 2;
  local_a0[0] = bVar41;
  pbStack_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!bVar41) {
    testing::Message::Message(&local_b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_80,(internal *)local_a0,(AssertionResult *)"num_erased == 2","false",
               "true",(char *)pkVar39);
    testing::internal::AssertHelper::AssertHelper
              (&local_c0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/erase_if_test.cc"
               ,0xe,(char *)local_80._0_8_);
    testing::internal::AssertHelper::operator=(&local_c0,&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_c0);
    if ((undefined1 *)local_80._0_8_ != local_80 + 0x10) {
      operator_delete((void *)local_80._0_8_,local_80._16_8_ + 1);
    }
    if ((long *)CONCAT71(local_b0.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._1_7_,
                         local_b0.ss_._M_t.
                         super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         .
                         super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                         ._M_head_impl._0_1_) != (long *)0x0) {
      (**(code **)(*(long *)CONCAT71(local_b0.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._1_7_,
                                     local_b0.ss_._M_t.
                                     super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     .
                                     super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                     ._M_head_impl._0_1_) + 8))();
    }
  }
  if (pbStack_98 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&pbStack_98,pbStack_98);
  }
  local_a0 = (undefined1  [8])0x200000000;
  pbStack_98 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x600000003;
  pkVar39 = (key_equal *)&local_c0;
  raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_int>,phmap::Hash<unsigned_int>,phmap::EqualTo<unsigned_int>,std::allocator<unsigned_int>>
  ::raw_hash_set<int_const*>
            ((raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_int>,phmap::Hash<unsigned_int>,phmap::EqualTo<unsigned_int>,std::allocator<unsigned_int>>
              *)local_80,(int *)local_a0,(int *)local_90._M_local_buf,0,(hasher *)&local_b0,pkVar39,
             (allocator_type *)&local_b8);
  uVar33 = local_80._16_8_;
  cVar2 = *(char *)local_80._0_8_;
  piVar32 = (int *)local_80._0_8_;
  aVar37 = (anon_union_8_1_a8a14541_for_iterator_1)local_80._8_8_;
  while (cVar2 < -1) {
    iVar12 = -(uint)(CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))) ==
                    CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))));
    iVar13 = -(uint)(CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))) ==
                    CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))));
    iVar14 = -(uint)(CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))) ==
                    CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))));
    iVar15 = -(uint)(CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))) ==
                    CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))));
    in_XMM1_Ba = -((char)*piVar32 < (char)iVar12);
    in_XMM1_Bb = -(*(char *)((long)piVar32 + 1) < (char)((uint)iVar12 >> 8));
    in_XMM1_Bc = -(*(char *)((long)piVar32 + 2) < (char)((uint)iVar12 >> 0x10));
    in_XMM1_Bd = -(*(char *)((long)piVar32 + 3) < (char)((uint)iVar12 >> 0x18));
    in_XMM1_Be = -((char)piVar32[1] < (char)iVar13);
    in_XMM1_Bf = -(*(char *)((long)piVar32 + 5) < (char)((uint)iVar13 >> 8));
    in_XMM1_Bg = -(*(char *)((long)piVar32 + 6) < (char)((uint)iVar13 >> 0x10));
    in_XMM1_Bh = -(*(char *)((long)piVar32 + 7) < (char)((uint)iVar13 >> 0x18));
    in_XMM1_Bi = -((char)piVar32[2] < (char)iVar14);
    in_XMM1_Bj = -(*(char *)((long)piVar32 + 9) < (char)((uint)iVar14 >> 8));
    in_XMM1_Bk = -(*(char *)((long)piVar32 + 10) < (char)((uint)iVar14 >> 0x10));
    in_XMM1_Bl = -(*(char *)((long)piVar32 + 0xb) < (char)((uint)iVar14 >> 0x18));
    in_XMM1_Bm = -((char)piVar32[3] < (char)iVar15);
    in_XMM1_Bn = -(*(char *)((long)piVar32 + 0xd) < (char)((uint)iVar15 >> 8));
    in_XMM1_Bo = -(*(char *)((long)piVar32 + 0xe) < (char)((uint)iVar15 >> 0x10));
    in_XMM1_Bp = -(*(char *)((long)piVar32 + 0xf) < (char)((uint)iVar15 >> 0x18));
    auVar6[1] = in_XMM1_Bb;
    auVar6[0] = in_XMM1_Ba;
    auVar6[2] = in_XMM1_Bc;
    auVar6[3] = in_XMM1_Bd;
    auVar6[4] = in_XMM1_Be;
    auVar6[5] = in_XMM1_Bf;
    auVar6[6] = in_XMM1_Bg;
    auVar6[7] = in_XMM1_Bh;
    auVar6[8] = in_XMM1_Bi;
    auVar6[9] = in_XMM1_Bj;
    auVar6[10] = in_XMM1_Bk;
    auVar6[0xb] = in_XMM1_Bl;
    auVar6[0xc] = in_XMM1_Bm;
    auVar6[0xd] = in_XMM1_Bn;
    auVar6[0xe] = in_XMM1_Bo;
    auVar6[0xf] = in_XMM1_Bp;
    auVar7[1] = in_XMM1_Bb;
    auVar7[0] = in_XMM1_Ba;
    auVar7[2] = in_XMM1_Bc;
    auVar7[3] = in_XMM1_Bd;
    auVar7[4] = in_XMM1_Be;
    auVar7[5] = in_XMM1_Bf;
    auVar7[6] = in_XMM1_Bg;
    auVar7[7] = in_XMM1_Bh;
    auVar7[8] = in_XMM1_Bi;
    auVar7[9] = in_XMM1_Bj;
    auVar7[10] = in_XMM1_Bk;
    auVar7[0xb] = in_XMM1_Bl;
    auVar7[0xc] = in_XMM1_Bm;
    auVar7[0xd] = in_XMM1_Bn;
    auVar7[0xe] = in_XMM1_Bo;
    auVar7[0xf] = in_XMM1_Bp;
    auVar30[1] = in_XMM1_Bd;
    auVar30[0] = in_XMM1_Bc;
    auVar30[2] = in_XMM1_Be;
    auVar30[3] = in_XMM1_Bf;
    auVar30[4] = in_XMM1_Bg;
    auVar30[5] = in_XMM1_Bh;
    auVar30[6] = in_XMM1_Bi;
    auVar30[7] = in_XMM1_Bj;
    auVar30[8] = in_XMM1_Bk;
    auVar30[9] = in_XMM1_Bl;
    auVar30[10] = in_XMM1_Bm;
    auVar30[0xb] = in_XMM1_Bn;
    auVar30[0xc] = in_XMM1_Bo;
    auVar30[0xd] = in_XMM1_Bp;
    auVar26[1] = in_XMM1_Be;
    auVar26[0] = in_XMM1_Bd;
    auVar26[2] = in_XMM1_Bf;
    auVar26[3] = in_XMM1_Bg;
    auVar26[4] = in_XMM1_Bh;
    auVar26[5] = in_XMM1_Bi;
    auVar26[6] = in_XMM1_Bj;
    auVar26[7] = in_XMM1_Bk;
    auVar26[8] = in_XMM1_Bl;
    auVar26[9] = in_XMM1_Bm;
    auVar26[10] = in_XMM1_Bn;
    auVar26[0xb] = in_XMM1_Bo;
    auVar26[0xc] = in_XMM1_Bp;
    auVar22[1] = in_XMM1_Bf;
    auVar22[0] = in_XMM1_Be;
    auVar22[2] = in_XMM1_Bg;
    auVar22[3] = in_XMM1_Bh;
    auVar22[4] = in_XMM1_Bi;
    auVar22[5] = in_XMM1_Bj;
    auVar22[6] = in_XMM1_Bk;
    auVar22[7] = in_XMM1_Bl;
    auVar22[8] = in_XMM1_Bm;
    auVar22[9] = in_XMM1_Bn;
    auVar22[10] = in_XMM1_Bo;
    auVar22[0xb] = in_XMM1_Bp;
    auVar18[1] = in_XMM1_Bg;
    auVar18[0] = in_XMM1_Bf;
    auVar18[2] = in_XMM1_Bh;
    auVar18[3] = in_XMM1_Bi;
    auVar18[4] = in_XMM1_Bj;
    auVar18[5] = in_XMM1_Bk;
    auVar18[6] = in_XMM1_Bl;
    auVar18[7] = in_XMM1_Bm;
    auVar18[8] = in_XMM1_Bn;
    auVar18[9] = in_XMM1_Bo;
    auVar18[10] = in_XMM1_Bp;
    uVar35 = (ushort)((ushort)(SUB161(auVar6 >> 7,0) & 1) |
                      (ushort)(SUB161(auVar7 >> 0xf,0) & 1) << 1 |
                      (ushort)(SUB141(auVar30 >> 7,0) & 1) << 2 |
                      (ushort)(SUB131(auVar26 >> 7,0) & 1) << 3 |
                      (ushort)(SUB121(auVar22 >> 7,0) & 1) << 4 |
                      (ushort)(SUB111(auVar18 >> 7,0) & 1) << 5 |
                      (ushort)((byte)(CONCAT19(in_XMM1_Bp,
                                               CONCAT18(in_XMM1_Bo,
                                                        CONCAT17(in_XMM1_Bn,
                                                                 CONCAT16(in_XMM1_Bm,
                                                                          CONCAT15(in_XMM1_Bl,
                                                                                   CONCAT14(
                                                  in_XMM1_Bk,
                                                  CONCAT13(in_XMM1_Bj,
                                                           CONCAT12(in_XMM1_Bi,
                                                                    CONCAT11(in_XMM1_Bh,in_XMM1_Bg))
                                                          ))))))) >> 7) & 1) << 6 |
                      (ushort)((byte)(CONCAT18(in_XMM1_Bp,
                                               CONCAT17(in_XMM1_Bo,
                                                        CONCAT16(in_XMM1_Bn,
                                                                 CONCAT15(in_XMM1_Bm,
                                                                          CONCAT14(in_XMM1_Bl,
                                                                                   CONCAT13(
                                                  in_XMM1_Bk,
                                                  CONCAT12(in_XMM1_Bj,
                                                           CONCAT11(in_XMM1_Bi,in_XMM1_Bh)))))))) >>
                                     7) & 1) << 7 | (ushort)(in_XMM1_Bp >> 7) << 0xf) + 1;
    uVar3 = 0;
    if (uVar35 != 0) {
      for (; (uVar35 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
      }
    }
    uVar38 = (ulong)uVar3;
    aVar37.slot_ = aVar37.slot_ + uVar38;
    cVar2 = *(char *)((long)piVar32 + uVar38);
    piVar32 = (int *)((long)piVar32 + uVar38);
  }
  it_00.field_1.slot_ = aVar37.slot_;
  it_00.ctrl_ = (ctrl_t *)piVar32;
  piVar40 = (int *)(local_80._0_8_ + local_80._24_8_);
  if (piVar32 != piVar40) {
    do {
      if (*it_00.field_1.slot_ < 3) {
        it_00 = raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<unsigned_int>_>
                ::erase((raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<unsigned_int>_>
                         *)local_80,it_00);
      }
      else {
        pcVar36 = it_00.ctrl_ + 1;
        aVar37.slot_ = it_00.field_1.slot_ + 1;
        if (it_00.ctrl_[1] < -1) {
          do {
            iVar12 = -(uint)(CONCAT13(in_XMM1_Bd,
                                      CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))) ==
                            CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))
                                    ));
            iVar13 = -(uint)(CONCAT13(in_XMM1_Bh,
                                      CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))) ==
                            CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))
                                    ));
            iVar14 = -(uint)(CONCAT13(in_XMM1_Bl,
                                      CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))) ==
                            CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))
                                    ));
            iVar15 = -(uint)(CONCAT13(in_XMM1_Bp,
                                      CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))) ==
                            CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))
                                    ));
            in_XMM1_Ba = -(*pcVar36 < (char)iVar12);
            in_XMM1_Bb = -(pcVar36[1] < (char)((uint)iVar12 >> 8));
            in_XMM1_Bc = -(pcVar36[2] < (char)((uint)iVar12 >> 0x10));
            in_XMM1_Bd = -(pcVar36[3] < (char)((uint)iVar12 >> 0x18));
            in_XMM1_Be = -(pcVar36[4] < (char)iVar13);
            in_XMM1_Bf = -(pcVar36[5] < (char)((uint)iVar13 >> 8));
            in_XMM1_Bg = -(pcVar36[6] < (char)((uint)iVar13 >> 0x10));
            in_XMM1_Bh = -(pcVar36[7] < (char)((uint)iVar13 >> 0x18));
            in_XMM1_Bi = -(pcVar36[8] < (char)iVar14);
            in_XMM1_Bj = -(pcVar36[9] < (char)((uint)iVar14 >> 8));
            in_XMM1_Bk = -(pcVar36[10] < (char)((uint)iVar14 >> 0x10));
            in_XMM1_Bl = -(pcVar36[0xb] < (char)((uint)iVar14 >> 0x18));
            in_XMM1_Bm = -(pcVar36[0xc] < (char)iVar15);
            in_XMM1_Bn = -(pcVar36[0xd] < (char)((uint)iVar15 >> 8));
            in_XMM1_Bo = -(pcVar36[0xe] < (char)((uint)iVar15 >> 0x10));
            in_XMM1_Bp = -(pcVar36[0xf] < (char)((uint)iVar15 >> 0x18));
            auVar8[1] = in_XMM1_Bb;
            auVar8[0] = in_XMM1_Ba;
            auVar8[2] = in_XMM1_Bc;
            auVar8[3] = in_XMM1_Bd;
            auVar8[4] = in_XMM1_Be;
            auVar8[5] = in_XMM1_Bf;
            auVar8[6] = in_XMM1_Bg;
            auVar8[7] = in_XMM1_Bh;
            auVar8[8] = in_XMM1_Bi;
            auVar8[9] = in_XMM1_Bj;
            auVar8[10] = in_XMM1_Bk;
            auVar8[0xb] = in_XMM1_Bl;
            auVar8[0xc] = in_XMM1_Bm;
            auVar8[0xd] = in_XMM1_Bn;
            auVar8[0xe] = in_XMM1_Bo;
            auVar8[0xf] = in_XMM1_Bp;
            auVar9[1] = in_XMM1_Bb;
            auVar9[0] = in_XMM1_Ba;
            auVar9[2] = in_XMM1_Bc;
            auVar9[3] = in_XMM1_Bd;
            auVar9[4] = in_XMM1_Be;
            auVar9[5] = in_XMM1_Bf;
            auVar9[6] = in_XMM1_Bg;
            auVar9[7] = in_XMM1_Bh;
            auVar9[8] = in_XMM1_Bi;
            auVar9[9] = in_XMM1_Bj;
            auVar9[10] = in_XMM1_Bk;
            auVar9[0xb] = in_XMM1_Bl;
            auVar9[0xc] = in_XMM1_Bm;
            auVar9[0xd] = in_XMM1_Bn;
            auVar9[0xe] = in_XMM1_Bo;
            auVar9[0xf] = in_XMM1_Bp;
            auVar31[1] = in_XMM1_Bd;
            auVar31[0] = in_XMM1_Bc;
            auVar31[2] = in_XMM1_Be;
            auVar31[3] = in_XMM1_Bf;
            auVar31[4] = in_XMM1_Bg;
            auVar31[5] = in_XMM1_Bh;
            auVar31[6] = in_XMM1_Bi;
            auVar31[7] = in_XMM1_Bj;
            auVar31[8] = in_XMM1_Bk;
            auVar31[9] = in_XMM1_Bl;
            auVar31[10] = in_XMM1_Bm;
            auVar31[0xb] = in_XMM1_Bn;
            auVar31[0xc] = in_XMM1_Bo;
            auVar31[0xd] = in_XMM1_Bp;
            auVar27[1] = in_XMM1_Be;
            auVar27[0] = in_XMM1_Bd;
            auVar27[2] = in_XMM1_Bf;
            auVar27[3] = in_XMM1_Bg;
            auVar27[4] = in_XMM1_Bh;
            auVar27[5] = in_XMM1_Bi;
            auVar27[6] = in_XMM1_Bj;
            auVar27[7] = in_XMM1_Bk;
            auVar27[8] = in_XMM1_Bl;
            auVar27[9] = in_XMM1_Bm;
            auVar27[10] = in_XMM1_Bn;
            auVar27[0xb] = in_XMM1_Bo;
            auVar27[0xc] = in_XMM1_Bp;
            auVar23[1] = in_XMM1_Bf;
            auVar23[0] = in_XMM1_Be;
            auVar23[2] = in_XMM1_Bg;
            auVar23[3] = in_XMM1_Bh;
            auVar23[4] = in_XMM1_Bi;
            auVar23[5] = in_XMM1_Bj;
            auVar23[6] = in_XMM1_Bk;
            auVar23[7] = in_XMM1_Bl;
            auVar23[8] = in_XMM1_Bm;
            auVar23[9] = in_XMM1_Bn;
            auVar23[10] = in_XMM1_Bo;
            auVar23[0xb] = in_XMM1_Bp;
            auVar19[1] = in_XMM1_Bg;
            auVar19[0] = in_XMM1_Bf;
            auVar19[2] = in_XMM1_Bh;
            auVar19[3] = in_XMM1_Bi;
            auVar19[4] = in_XMM1_Bj;
            auVar19[5] = in_XMM1_Bk;
            auVar19[6] = in_XMM1_Bl;
            auVar19[7] = in_XMM1_Bm;
            auVar19[8] = in_XMM1_Bn;
            auVar19[9] = in_XMM1_Bo;
            auVar19[10] = in_XMM1_Bp;
            uVar35 = (ushort)((ushort)(SUB161(auVar8 >> 7,0) & 1) |
                              (ushort)(SUB161(auVar9 >> 0xf,0) & 1) << 1 |
                              (ushort)(SUB141(auVar31 >> 7,0) & 1) << 2 |
                              (ushort)(SUB131(auVar27 >> 7,0) & 1) << 3 |
                              (ushort)(SUB121(auVar23 >> 7,0) & 1) << 4 |
                              (ushort)(SUB111(auVar19 >> 7,0) & 1) << 5 |
                              (ushort)((byte)(CONCAT19(in_XMM1_Bp,
                                                       CONCAT18(in_XMM1_Bo,
                                                                CONCAT17(in_XMM1_Bn,
                                                                         CONCAT16(in_XMM1_Bm,
                                                                                  CONCAT15(
                                                  in_XMM1_Bl,
                                                  CONCAT14(in_XMM1_Bk,
                                                           CONCAT13(in_XMM1_Bj,
                                                                    CONCAT12(in_XMM1_Bi,
                                                                             CONCAT11(in_XMM1_Bh,
                                                                                      in_XMM1_Bg))))
                                                  ))))) >> 7) & 1) << 6 |
                              (ushort)((byte)(CONCAT18(in_XMM1_Bp,
                                                       CONCAT17(in_XMM1_Bo,
                                                                CONCAT16(in_XMM1_Bn,
                                                                         CONCAT15(in_XMM1_Bm,
                                                                                  CONCAT14(
                                                  in_XMM1_Bl,
                                                  CONCAT13(in_XMM1_Bk,
                                                           CONCAT12(in_XMM1_Bj,
                                                                    CONCAT11(in_XMM1_Bi,in_XMM1_Bh))
                                                          )))))) >> 7) & 1) << 7 |
                             (ushort)(in_XMM1_Bp >> 7) << 0xf) + 1;
            uVar3 = 0;
            if (uVar35 != 0) {
              for (; (uVar35 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
              }
            }
            aVar37.slot_ = aVar37.slot_ + uVar3;
            it_00.field_1.slot_ = aVar37.slot_;
            it_00.ctrl_ = pcVar36 + uVar3;
            pcVar1 = pcVar36 + uVar3;
            pcVar36 = pcVar36 + uVar3;
          } while (*pcVar1 < -1);
        }
        else {
          it_00.field_1.slot_ = aVar37.slot_;
          it_00.ctrl_ = pcVar36;
        }
      }
    } while ((int *)it_00.ctrl_ != piVar40);
  }
  local_b0.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_1_ = (key_equal)(uVar33 - local_80._16_8_ == 2);
  local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_b0.ss_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl._0_1_) {
    testing::Message::Message((Message *)&local_c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a0,(internal *)&local_b0,(AssertionResult *)"num_erased == 2","false"
               ,"true",(char *)pkVar39);
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/erase_if_test.cc"
               ,0x12,(char *)local_a0);
    testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    if (local_a0 != (undefined1  [8])&local_90) {
      operator_delete((void *)local_a0,local_90._M_allocated_capacity + 1);
    }
    if (local_c0.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_c0.data_ + 8))();
    }
  }
  if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a8,local_a8);
  }
  local_b0.ss_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl._0_1_ =
       (key_equal)
       operator==(&local_50,
                  (raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)local_80);
  local_a8 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (!(bool)local_b0.ss_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl._0_1_) {
    testing::Message::Message((Message *)&local_c0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)local_a0,(internal *)&local_b0,(AssertionResult *)"st1 == st2","false",
               "true",(char *)pkVar39);
    testing::internal::AssertHelper::AssertHelper
              (&local_b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/erase_if_test.cc"
               ,0x14,(char *)local_a0);
    testing::internal::AssertHelper::operator=(&local_b8,(Message *)&local_c0);
    testing::internal::AssertHelper::~AssertHelper(&local_b8);
    if (local_a0 != (undefined1  [8])&local_90) {
      operator_delete((void *)local_a0,local_90._M_allocated_capacity + 1);
    }
    if (local_c0.data_ != (AssertHelperData *)0x0) {
      (**(code **)(*(long *)local_c0.data_ + 8))();
    }
  }
  if (local_a8 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_a8,local_a8);
  }
  raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<unsigned_int>_>
  ::destroy_slots((raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)local_80);
  raw_hash_set<phmap::priv::FlatHashSetPolicy<unsigned_int>,_phmap::Hash<unsigned_int>,_phmap::EqualTo<unsigned_int>,_std::allocator<unsigned_int>_>
  ::destroy_slots(&local_50);
  return;
}

Assistant:

TEST(EraseIf, FlatHashSet_uint32) {
    phmap::flat_hash_set<uint32_t> st1 = { 3, 6, 7, 9 };
    auto num_erased = erase_if(st1, [](const uint32_t& v) { return v >= 7; });
    EXPECT_TRUE(num_erased == 2);

    phmap::flat_hash_set<uint32_t> st2 = { 0, 2, 3, 6 };
    num_erased = erase_if(st2, [](const uint32_t& v) { return v <= 2; });
    EXPECT_TRUE(num_erased == 2);

    EXPECT_TRUE(st1 == st2);
}